

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Tensor<1> __thiscall Omega_h::metric_from_hessian<1>(Omega_h *this,Tensor<1> hessian,Real eps)

{
  int iVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  Real extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double local_930;
  double local_910;
  double local_908;
  int local_8e4;
  Int i_5;
  Vector<1> tilde_l;
  int c_denom;
  int c_num;
  Vector<1> l;
  Tensor<1> r;
  DiagDecomp<1> ed;
  Real eps_local;
  Tensor<1> hessian_local;
  DiagDecomp<1> decomp;
  Real nm;
  int local_814;
  Int i_4;
  double local_808 [2];
  Vector<1> c_2;
  int local_7d8;
  int local_7d4;
  Int i;
  Int j;
  Real x;
  double local_7b8;
  int local_7ac;
  Real *local_7a8;
  int local_79c;
  Real *local_798;
  double local_780;
  int local_76c;
  double dStack_768;
  Int j_2;
  Few<Omega_h::Vector<1>,_1> local_760 [2];
  Matrix<1,_1> c;
  Few<double,_1> roots;
  Roots<1> roots_obj;
  Matrix<1,_1> o;
  int local_680;
  int local_67c;
  Int i_1;
  Int j_1;
  Matrix<1,_1> a;
  int local_644;
  Int i_2;
  Vector<1> v;
  int local_61c;
  Int i_3;
  Few<double,_1> local_610;
  double local_608;
  Vector<1> c_1;
  Few<double,_1> poly;
  Vector<1> v_1;
  Few<double,_1> coeffs;
  undefined1 local_554 [4];
  undefined1 auStack_550 [4];
  Few<int,_1> mults;
  Few<double,_1> roots_1;
  double a_1;
  undefined1 local_538 [12];
  undefined4 local_52c;
  undefined1 *local_528;
  undefined4 local_51c;
  undefined1 *local_518;
  undefined4 local_50c;
  undefined1 *local_508;
  undefined8 local_500;
  undefined4 local_4f4;
  undefined8 *local_4f0;
  undefined4 local_4e4;
  undefined8 *local_4e0;
  double local_4d8;
  Real bm;
  Real am;
  double local_4b0;
  double local_4a8;
  Real local_4a0;
  int local_43c;
  Int j_6;
  Few<Omega_h::Vector<1>,_1> local_428;
  Matrix<1,_1> c_8;
  int local_3e4;
  Int j_4;
  Matrix<1,_1> c_3;
  int local_3a4;
  int local_3a0;
  Int i_7;
  Int j_3;
  Int i_6;
  Tensor<1> a_2;
  int local_2f4;
  Int j_5;
  double local_2e8 [3];
  Vector<1> c_4;
  int local_28c;
  Int i_9;
  double local_280 [2];
  Vector<1> c_6;
  int local_24c;
  Int i_8;
  double local_240 [2];
  Vector<1> c_5;
  int local_1ec;
  Int j_7;
  double local_1e0 [3];
  Vector<1> c_9;
  int local_184;
  Int i_12;
  double local_178 [2];
  Vector<1> c_11;
  int local_144;
  Int i_11;
  double local_138 [2];
  Vector<1> c_10;
  int local_104;
  Int i_13;
  double local_f8 [2];
  Vector<1> c_12;
  int local_b4;
  Int i_10;
  double local_a8 [2];
  Vector<1> c_7;
  Matrix<1,_1> o_1;
  
  _i = 0.0;
  x = (Real)hessian.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0];
  for (local_7d4 = 0; local_7d4 < 1; local_7d4 = local_7d4 + 1) {
    for (local_7d8 = 0; local_7d8 < 1; local_7d8 = local_7d8 + 1) {
      local_798 = &x;
      local_79c = local_7d4;
      local_7a8 = local_798 + local_7d4;
      local_7ac = local_7d8;
      std::abs((int)this);
      local_7b8 = _i;
      local_908 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= _i) {
        local_908 = _i;
      }
      _i = local_908;
    }
  }
  if (1e-10 < _i) {
    dStack_768 = _i;
    for (local_76c = 0; local_76c < 1; local_76c = local_76c + 1) {
      local_780 = local_760[local_76c].array_[0].super_Few<double,_1>.array_[0];
      for (local_61c = 0; local_61c < 1; local_61c = local_61c + 1) {
        iVar1 = local_61c;
        (&c_1)[(long)local_61c + -1].super_Few<double,_1>.array_[0] =
             (&local_610)[local_61c].array_[0] / _i;
        c_1.super_Few<double,_1>.array_[0]._4_4_ = iVar1;
      }
      iVar1 = local_76c;
      (&c)[(long)local_76c + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.
      array_[0] = local_608;
      c.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]._4_4_ = iVar1;
      local_610.array_[0] = (double  [1])(double  [1])local_780;
    }
    local_500 = local_760[1].array_[0].super_Few<double,_1>.array_[0];
    local_4f0 = &local_500;
    local_4e4 = 0;
    local_4f4 = 0;
    local_518 = local_538;
    local_51c = 0;
    local_528 = auStack_550;
    local_52c = 0;
    local_508 = local_554;
    local_50c = 0;
    am = 1e-10;
    local_760[0].array_[0].super_Few<double,_1>.array_[0] =
         (Vector<1>  [1])
         (Vector<1>  [1])
         hessian.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0];
    local_4e0 = local_4f0;
    std::abs((int)this);
    bm = extraout_XMM0_Qa_00;
    std::abs((int)this);
    if ((am < bm) || (am < extraout_XMM0_Qa_01)) {
      local_4d8 = extraout_XMM0_Qa_01;
      std::abs((int)this);
      local_4a0 = bm;
      local_4a8 = local_4d8;
      if (local_4d8 <= bm) {
        local_930 = bm;
      }
      else {
        local_930 = local_4d8;
      }
      local_4b0 = extraout_XMM0_Qa_02 / local_930;
    }
    else {
      local_4b0 = 0.0;
    }
    if (1e-10 < local_4b0) {
      fail("assertion %s failed at %s +%d\n","are_close(roots[0], m[0][0])",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
           ,0x123);
    }
    for (local_814 = 0; local_814 < 1; local_814 = local_814 + 1) {
      iVar1 = local_814;
      (&c_2)[(long)local_814 + -1].super_Few<double,_1>.array_[0] = local_808[local_814] * _i;
      c_2.super_Few<double,_1>.array_[0]._4_4_ = iVar1;
    }
  }
  else {
    for (local_67c = 0; local_67c < 1; local_67c = local_67c + 1) {
      for (local_680 = 0; local_680 < 1; local_680 = local_680 + 1) {
        local_910 = 1.0;
        if (local_680 != local_67c) {
          local_910 = 0.0;
        }
        iVar1 = local_680;
        (&a)[(long)local_67c + (long)local_680 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
        super_Few<double,_1>.array_[0] = local_910;
        a.super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.array_[0]._4_4_ = iVar1;
      }
    }
    for (local_644 = 0; local_644 < 1; local_644 = local_644 + 1) {
      iVar1 = local_644;
      (&v)[(long)local_644 + -1].super_Few<double,_1>.array_[0] = 0.0;
      v.super_Few<double,_1>.array_[0]._4_4_ = iVar1;
    }
  }
  tilde_l.super_Few<double,_1>.array_[0]._4_4_ = 1;
  tilde_l.super_Few<double,_1>.array_[0]._0_4_ = 8;
  for (local_8e4 = 0; local_8e4 < 1; local_8e4 = local_8e4 + 1) {
    std::abs((int)this);
    *(double *)(&stack0xfffffffffffff720 + (long)local_8e4 * 8) =
         (extraout_XMM0_Qa_03 * 1.0) / (eps * 8.0);
  }
  for (i_7 = 0; local_3a0 = i_7, i_7 < 1; i_7 = i_7 + 1) {
    while (local_3a0 = local_3a0 + 1, local_3a0 < 1) {
      (&a_2)[(long)local_3a0 + (long)i_7 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
      super_Few<double,_1>.array_[0] = 0.0;
      (&a_2)[(long)i_7 + (long)local_3a0 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
      super_Few<double,_1>.array_[0] = 0.0;
    }
  }
  for (local_3a4 = 0; local_3a4 < 1; local_3a4 = local_3a4 + 1) {
    (&a_2)[(long)local_3a4 + (long)local_3a4 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].
    super_Few<double,_1>.array_[0] = *(double *)(&j_3 + (long)local_3a4 * 2);
  }
  for (local_3e4 = 0; local_3e4 < 1; local_3e4 = local_3e4 + 1) {
    dVar2 = *(double *)(&stack0xfffffffffffffc20 + (long)local_3e4 * 8);
    for (local_24c = 0; local_24c < 1; local_24c = local_24c + 1) {
      (&c_5)[(long)local_24c + -1].super_Few<double,_1>.array_[0] = local_240[local_24c] * dVar2;
    }
    local_2e8[2] = local_240[1];
    for (local_2f4 = 1; local_2f4 < 1; local_2f4 = local_2f4 + 1) {
      dVar2 = local_2e8[local_2f4];
      for (local_28c = 0; local_28c < 1; local_28c = local_28c + 1) {
        (&c_6)[(long)local_28c + -1].super_Few<double,_1>.array_[0] = local_280[local_28c] * dVar2;
      }
      for (local_b4 = 0; local_b4 < 1; local_b4 = local_b4 + 1) {
        (&c_7)[(long)local_b4 + -1].super_Few<double,_1>.array_[0] =
             local_a8[local_b4] + *(double *)(&stack0xffffffffffffff50 + (long)local_b4 * 8);
      }
      local_2e8[2] = local_a8[1];
    }
    (&c_3)[(long)local_3e4 + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.
    array_[0] = local_2e8[2];
  }
  for (local_43c = 0; local_43c < 1; local_43c = local_43c + 1) {
    dVar2 = *(double *)(&stack0xfffffffffffffbc8 + (long)local_43c * 8);
    for (local_144 = 0; local_144 < 1; local_144 = local_144 + 1) {
      (&c_10)[(long)local_144 + -1].super_Few<double,_1>.array_[0] = local_138[local_144] * dVar2;
    }
    local_1e0[2] = local_138[1];
    for (local_1ec = 1; local_1ec < 1; local_1ec = local_1ec + 1) {
      dVar2 = local_1e0[local_1ec];
      for (local_184 = 0; local_184 < 1; local_184 = local_184 + 1) {
        (&c_11)[(long)local_184 + -1].super_Few<double,_1>.array_[0] = local_178[local_184] * dVar2;
      }
      for (local_104 = 0; local_104 < 1; local_104 = local_104 + 1) {
        (&c_12)[(long)local_104 + -1].super_Few<double,_1>.array_[0] =
             local_f8[local_104] + *(double *)(&stack0xffffffffffffff00 + (long)local_104 * 8);
      }
      local_1e0[2] = local_f8[1];
    }
    (&c_8)[(long)local_43c + -1].super_Few<Omega_h::Vector<1>,_1>.array_[0].super_Few<double,_1>.
    array_[0] = local_1e0[2];
  }
  return (Few<Omega_h::Vector<1>,_1>)
         (Few<Omega_h::Vector<1>,_1>)local_428.array_[0].super_Few<double,_1>.array_[0];
}

Assistant:

static OMEGA_H_INLINE_BIG Tensor<dim> metric_from_hessian(
    Tensor<dim> const hessian, Real const eps) {
  auto const ed = decompose_eigen(hessian);
  auto const r = ed.q;
  auto const l = ed.l;
  constexpr auto c_num = square(dim);
  constexpr auto c_denom = 2 * square(dim + 1);
  decltype(ed.l) tilde_l;
  for (Int i = 0; i < dim; ++i) {
    tilde_l[i] = (c_num * std::abs(l[i])) / (c_denom * eps);
  }
  return compose_eigen(r, tilde_l);
}